

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

stbi_uc * stbi__readval(stbi__context *s,int channel,stbi_uc *dest)

{
  stbi_uc *psVar1;
  stbi_uc sVar2;
  int iVar3;
  stbi_uc *psVar4;
  undefined8 *puVar5;
  stbi_uc *psVar6;
  long lVar7;
  uint uVar8;
  
  psVar1 = s->buffer_start;
  uVar8 = 0x80;
  lVar7 = 0;
  do {
    if ((uVar8 & channel) != 0) {
      if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_0011eff2:
        psVar4 = s->img_buffer;
        psVar6 = s->img_buffer_end;
        if (psVar6 <= psVar4) {
LAB_0011f093:
          puVar5 = (undefined8 *)__tls_get_addr(&PTR_0012de18);
          *puVar5 = "bad file";
          return (stbi_uc *)0x0;
        }
      }
      else {
        iVar3 = (*(s->io).eof)(s->io_user_data);
        if (iVar3 != 0) {
          if (s->read_from_callbacks == 0) goto LAB_0011f093;
          goto LAB_0011eff2;
        }
        psVar4 = s->img_buffer;
        psVar6 = s->img_buffer_end;
      }
      if (psVar4 < psVar6) {
        s->img_buffer = psVar4 + 1;
        sVar2 = *psVar4;
      }
      else if (s->read_from_callbacks == 0) {
        sVar2 = '\0';
      }
      else {
        iVar3 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
        if (iVar3 == 0) {
          s->read_from_callbacks = 0;
          s->buffer_start[0] = '\0';
          sVar2 = '\0';
          psVar4 = s->buffer_start + 1;
        }
        else {
          sVar2 = *psVar1;
          psVar4 = psVar1 + iVar3;
        }
        s->img_buffer_end = psVar4;
        s->img_buffer = s->buffer_start + 1;
      }
      dest[lVar7] = sVar2;
    }
    lVar7 = lVar7 + 1;
    uVar8 = uVar8 >> 1;
    if (lVar7 == 4) {
      return dest;
    }
  } while( true );
}

Assistant:

static stbi_uc *stbi__readval(stbi__context *s, int channel, stbi_uc *dest)
{
   int mask=0x80, i;

   for (i=0; i<4; ++i, mask>>=1) {
      if (channel & mask) {
         if (stbi__at_eof(s)) return stbi__errpuc("bad file","PIC file too short");
         dest[i]=stbi__get8(s);
      }
   }

   return dest;
}